

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZTriangleTorus>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZTriangleTorus> *this,TPZGeoMesh *DestMesh,
          TPZGeoElRefLess<pzgeom::TPZTriangleTorus> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  bool bVar1;
  TPZGeoEl *pTVar2;
  TPZGeoEl *in_RDX;
  TPZRegisterClassId *in_RDI;
  int side;
  int64_t neighIdx;
  TPZGeoElSide neigh;
  int n;
  int i;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *in_stack_00000260
  ;
  TPZGeoEl *in_stack_00000268;
  TPZGeoMesh *in_stack_00000270;
  void **in_stack_00000278;
  TPZGeoEl *in_stack_00000280;
  TPZGeoElSide *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  TPZGeoElSide *in_stack_fffffffffffffe98;
  TPZGeoMesh *in_stack_fffffffffffffea0;
  TPZTriangleTorus *in_stack_fffffffffffffea8;
  TPZTriangleTorus *in_stack_fffffffffffffeb0;
  key_type_conflict1 *in_stack_fffffffffffffec8;
  TPZGeoElSide *in_stack_fffffffffffffed0;
  TPZRegisterClassId *local_d8;
  TPZGeoElSideIndex local_b8;
  key_type_conflict1 local_a0 [3];
  _Self local_88;
  _Self local_80;
  int local_74;
  int64_t local_70;
  TPZGeoElSide local_68;
  undefined4 local_4c;
  int local_48;
  undefined8 local_38;
  undefined8 local_30;
  TPZGeoEl *local_18;
  
  local_30 = 0;
  local_38 = 0x21;
  local_18 = in_RDX;
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefLess<pzgeom::TPZTriangleTorus>>(in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_0245f790);
  TPZGeoEl::TPZGeoEl(in_stack_00000280,in_stack_00000278,in_stack_00000270,in_stack_00000268,
                     in_stack_00000260);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_0245f478;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefLess_0245f478;
  pzgeom::TPZTriangleTorus::TPZTriangleTorus
            (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
             (map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
             in_stack_fffffffffffffea0);
  local_d8 = in_RDI + 0x1d8;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex
              ((TPZGeoElSideIndex *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    local_d8 = local_d8 + 0x18;
  } while (local_d8 != in_RDI + 0x280);
  local_4c = 7;
  for (local_48 = 0; local_48 < 7; local_48 = local_48 + 1) {
    TPZGeoEl::Mesh(local_18);
    TPZGeoElSide::TPZGeoElSide
              ((TPZGeoElSide *)in_stack_fffffffffffffeb0,
               (TPZGeoElSideIndex *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    pTVar2 = TPZGeoElSide::Element(&local_68);
    local_70 = TPZGeoEl::Index(pTVar2);
    local_74 = TPZGeoElSide::Side(&local_68);
    while( true ) {
      local_80._M_node =
           (_Base_ptr)
           std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
           find((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
                in_stack_fffffffffffffe88,(key_type_conflict1 *)0x1725c9c);
      local_88._M_node =
           (_Base_ptr)
           std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::end
                     ((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                       *)in_stack_fffffffffffffe88);
      bVar1 = std::operator==(&local_80,&local_88);
      if (!bVar1) break;
      TPZGeoElSide::Neighbour(in_stack_fffffffffffffe98);
      in_stack_fffffffffffffed0 = &local_68;
      in_stack_fffffffffffffec8 = local_a0;
      TPZGeoElSide::operator=
                ((TPZGeoElSide *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                 in_stack_fffffffffffffe88);
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1725d23);
      pTVar2 = TPZGeoElSide::Element(in_stack_fffffffffffffed0);
      local_70 = TPZGeoEl::Index(pTVar2);
      local_74 = TPZGeoElSide::Side(&local_68);
    }
    in_stack_fffffffffffffea0 =
         (TPZGeoMesh *)
         std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
         operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                     *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    TPZGeoElSideIndex::TPZGeoElSideIndex
              ((TPZGeoElSideIndex *)in_stack_fffffffffffffea0,(int64_t)in_stack_fffffffffffffe98,
               in_stack_fffffffffffffe94);
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)(in_RDI + (long)local_48 * 0x18 + 0x1d8),&local_b8);
    TPZGeoElSideIndex::~TPZGeoElSideIndex((TPZGeoElSideIndex *)0x1725ea6);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1725eb3);
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess( TPZGeoMesh &DestMesh,
									   const TPZGeoElRefLess &cp,
									   std::map<int64_t,int64_t> & gl2lcNdMap,
									   std::map<int64_t,int64_t> & gl2lcElMap ) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),TPZGeoEl(DestMesh, cp, gl2lcElMap), fGeo(cp.fGeo, gl2lcNdMap)
{
	int i;
	const int n = TGeo::NSides;
	
	for(i = 0; i < n; i++)
	{
		TPZGeoElSide neigh (cp.fNeighbours[i],cp.Mesh());
		int64_t neighIdx = neigh.Element()->Index();
		int side = neigh.Side();
		
		while (gl2lcElMap.find(neighIdx)==gl2lcElMap.end())
		{
			neigh = neigh.Neighbour();
			neighIdx = neigh.Element()->Index();
			side = neigh.Side();
		}
		this->fNeighbours[i] = TPZGeoElSideIndex ( gl2lcElMap [ neighIdx ] , side );
	}
}